

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void COVER_best_finish(COVER_best_t *best,ZDICT_cover_params_t parameters,
                      COVER_dictSelection_t selection)

{
  void *__ptr;
  size_t sVar1;
  
  if (best == (COVER_best_t *)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)best);
  sVar1 = best->liveJobs - 1;
  best->liveJobs = sVar1;
  if (selection.totalCompressedSize < best->compressedSize) {
    __ptr = best->dict;
    if ((__ptr == (void *)0x0) || (best->dictSize < selection.dictSize)) {
      free(__ptr);
      __ptr = malloc(selection.dictSize);
      best->dict = __ptr;
      if (__ptr == (void *)0x0) {
        best->compressedSize = 0xffffffffffffffff;
        best->dictSize = 0;
        pthread_cond_signal((pthread_cond_t *)&best->cond);
        goto LAB_00178258;
      }
    }
    if (selection.dictContent != (BYTE *)0x0) {
      memcpy(__ptr,selection.dictContent,selection.dictSize);
      best->dictSize = selection.dictSize;
      (best->parameters).k = parameters.k;
      (best->parameters).d = parameters.d;
      (best->parameters).steps = parameters.steps;
      (best->parameters).nbThreads = parameters.nbThreads;
      (best->parameters).splitPoint = parameters.splitPoint;
      (best->parameters).shrinkDict = parameters.shrinkDict;
      (best->parameters).shrinkDictMaxRegression = parameters.shrinkDictMaxRegression;
      (best->parameters).zParams.compressionLevel = parameters.zParams.compressionLevel;
      (best->parameters).zParams.notificationLevel = parameters.zParams.notificationLevel;
      *(undefined8 *)&(best->parameters).zParams.dictID = parameters._40_8_;
      best->compressedSize = selection.totalCompressedSize;
    }
  }
  if (sVar1 == 0) {
    pthread_cond_broadcast((pthread_cond_t *)&best->cond);
  }
LAB_00178258:
  pthread_mutex_unlock((pthread_mutex_t *)best);
  return;
}

Assistant:

void COVER_best_finish(COVER_best_t *best, ZDICT_cover_params_t parameters,
                              COVER_dictSelection_t selection) {
  void* dict = selection.dictContent;
  size_t compressedSize = selection.totalCompressedSize;
  size_t dictSize = selection.dictSize;
  if (!best) {
    return;
  }
  {
    size_t liveJobs;
    ZSTD_pthread_mutex_lock(&best->mutex);
    --best->liveJobs;
    liveJobs = best->liveJobs;
    /* If the new dictionary is better */
    if (compressedSize < best->compressedSize) {
      /* Allocate space if necessary */
      if (!best->dict || best->dictSize < dictSize) {
        if (best->dict) {
          free(best->dict);
        }
        best->dict = malloc(dictSize);
        if (!best->dict) {
          best->compressedSize = ERROR(GENERIC);
          best->dictSize = 0;
          ZSTD_pthread_cond_signal(&best->cond);
          ZSTD_pthread_mutex_unlock(&best->mutex);
          return;
        }
      }
      /* Save the dictionary, parameters, and size */
      if (dict) {
        memcpy(best->dict, dict, dictSize);
        best->dictSize = dictSize;
        best->parameters = parameters;
        best->compressedSize = compressedSize;
      }
    }
    if (liveJobs == 0) {
      ZSTD_pthread_cond_broadcast(&best->cond);
    }
    ZSTD_pthread_mutex_unlock(&best->mutex);
  }
}